

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitReturn
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,Return *curr)

{
  bool bVar1;
  BasicType local_24;
  Type local_20;
  Type type;
  Return *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  
  type.id = (uintptr_t)curr;
  if (this->func == (Function *)0x0) {
    __assert_fail("func",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,0x2d4,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitReturn(Return *) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                 );
  }
  local_20 = Function::getResults(this->func);
  local_24 = none;
  bVar1 = wasm::Type::operator!=(&local_20,&local_24);
  if (bVar1) {
    note(this,(Expression **)(type.id + 0x10),local_20);
  }
  return;
}

Assistant:

void visitReturn(Return* curr) {
    assert(func);
    auto type = func->getResults();
    if (type != Type::none) {
      note(&curr->value, type);
    }
  }